

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O3

string * __thiscall
t_html_generator::make_file_link
          (string *__return_storage_ptr__,t_html_generator *this,string *filename)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((string *)&this->current_file_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar2 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_html_generator::make_file_link(std::string filename) {
  return (current_file_.compare(filename) != 0) ? filename : "";
}